

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm-utf8check.cpp
# Opt level: O2

bool arangodb::velocypack::validate_utf8_fast_sse42(uint8_t *src,size_t len)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  __m128i current_bytes;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char buffer [16];
  longlong local_c8;
  longlong lStack_c0;
  ulong local_b0;
  processed_utf_bytes local_a8;
  longlong local_78;
  longlong lStack_70;
  longlong local_68;
  longlong lStack_60;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  
  local_c8 = 0;
  lStack_c0 = 0;
  local_a8.carried_continuations[0] = 0;
  local_a8.carried_continuations[1] = 0;
  local_a8.high_nibbles[0] = 0;
  local_a8.high_nibbles[1] = 0;
  local_a8.rawbytes[0] = 0;
  local_a8.rawbytes[1] = 0;
  if (len < 0x10) {
    uVar3 = 0;
  }
  else {
    uVar1 = len - 0x10;
    local_b0 = len;
    for (uVar3 = 0; len = local_b0, uVar3 <= uVar1; uVar3 = uVar3 + 0x10) {
      checkUTF8Bytes(*(__m128i *)(src + uVar3),&local_a8,(__m128i *)&local_c8);
      local_a8.rawbytes[0] = local_78;
      local_a8.rawbytes[1] = lStack_70;
      local_a8.high_nibbles[0] = local_68;
      local_a8.high_nibbles[1] = lStack_60;
      local_a8.carried_continuations[0] = local_58;
      local_a8.carried_continuations[1] = lStack_50;
    }
  }
  if (len < uVar3 || len - uVar3 == 0) {
    auVar4[0] = -('\t' < (char)local_a8.carried_continuations[0]);
    auVar4[1] = -('\t' < local_a8.carried_continuations[0]._1_1_);
    auVar4[2] = -('\t' < local_a8.carried_continuations[0]._2_1_);
    auVar4[3] = -('\t' < local_a8.carried_continuations[0]._3_1_);
    auVar4[4] = -('\t' < local_a8.carried_continuations[0]._4_1_);
    auVar4[5] = -('\t' < local_a8.carried_continuations[0]._5_1_);
    auVar4[6] = -('\t' < local_a8.carried_continuations[0]._6_1_);
    auVar4[7] = -('\t' < local_a8.carried_continuations[0]._7_1_);
    auVar4[8] = -('\t' < (char)local_a8.carried_continuations[1]);
    auVar4[9] = -('\t' < local_a8.carried_continuations[1]._1_1_);
    auVar4[10] = -('\t' < local_a8.carried_continuations[1]._2_1_);
    auVar4[0xb] = -('\t' < local_a8.carried_continuations[1]._3_1_);
    auVar4[0xc] = -('\t' < local_a8.carried_continuations[1]._4_1_);
    auVar4[0xd] = -('\t' < local_a8.carried_continuations[1]._5_1_);
    auVar4[0xe] = -('\t' < local_a8.carried_continuations[1]._6_1_);
    auVar4[0xf] = -('\x01' < local_a8.carried_continuations[1]._7_1_);
    auVar2._8_8_ = lStack_c0;
    auVar2._0_8_ = local_c8;
    auVar5 = auVar4 | auVar2;
  }
  else {
    local_48 = 0;
    lStack_40 = 0;
    memcpy(&local_48,src + uVar3,len - uVar3);
    current_bytes[1] = lStack_40;
    current_bytes[0] = local_48;
    checkUTF8Bytes(current_bytes,&local_a8,(__m128i *)&local_c8);
    auVar5._8_8_ = lStack_c0;
    auVar5._0_8_ = local_c8;
  }
  return auVar5 == (undefined1  [16])0x0;
}

Assistant:

bool validate_utf8_fast_sse42(uint8_t const* src, std::size_t len) {
  std::size_t i = 0;
  __m128i has_error = _mm_setzero_si128();
  struct processed_utf_bytes previous = {
      .rawbytes = _mm_setzero_si128(),
      .high_nibbles = _mm_setzero_si128(),
      .carried_continuations = _mm_setzero_si128()};
  if (len >= 16) {
    for (; i <= len - 16; i += 16) {
      __m128i current_bytes = _mm_loadu_si128((const __m128i*)(src + i));
      previous = checkUTF8Bytes(current_bytes, &previous, &has_error);
    }
  }

  // last part
  if (i < len) {
    char buffer[16];
    memset(buffer, 0, 16);
    memcpy(buffer, src + i, len - i);
    __m128i current_bytes = _mm_loadu_si128((const __m128i*)(buffer));
    previous = checkUTF8Bytes(current_bytes, &previous, &has_error);
  } else {
    has_error = _mm_or_si128(
        _mm_cmpgt_epi8(
            previous.carried_continuations,
            _mm_setr_epi8(9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 1)),
        has_error);
  }

  return _mm_testz_si128(has_error, has_error);
}